

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O2

TermList Shell::AnswerLiteralManager::possiblyEvaluateAnswerTerm(TermList aT)

{
  bool bVar1;
  uint predicate;
  OperatorType *type;
  Literal *lit;
  uint taArity;
  bool constTrue;
  bool constant;
  Literal *res;
  InterpretedLiteralEvaluator eval;
  
  if (((aT._content & 3) == 0) && (*(uint *)(aT._content + 8) < 0xfffffff9)) {
    Kernel::InterpretedLiteralEvaluator::InterpretedLiteralEvaluator(&eval,true);
    taArity = 0;
    predicate = Kernel::Signature::addFreshPredicate(DAT_00a14190,1,"p",(char *)0x0);
    res = (Literal *)Kernel::SortHelper::getResultSort((Term *)aT._content);
    type = Kernel::OperatorType::getPredicateType
                     ((OperatorType *)&res,(initializer_list<Kernel::TermList>)ZEXT816(1),taArity);
    Kernel::Signature::Symbol::setType((DAT_00a14190->_preds)._stack[predicate],type);
    lit = Kernel::Literal::create1(predicate,true,aT);
    res = (Literal *)0x0;
    bVar1 = Kernel::InterpretedLiteralEvaluator::evaluate(&eval,lit,&constant,&res,&constTrue);
    if (bVar1 && res != (Literal *)0x0) {
      aT._content = (res->super_Term)._args[*(uint *)&(res->super_Term).field_0xc & 0xfffffff].
                    _content;
    }
    Kernel::InterpretedLiteralEvaluator::~InterpretedLiteralEvaluator(&eval);
  }
  return (TermList)aT._content;
}

Assistant:

TermList AnswerLiteralManager::possiblyEvaluateAnswerTerm(TermList aT)
{
  if(aT.isTerm() && !aT.term()->isSpecial()){
    InterpretedLiteralEvaluator eval;
    unsigned p = env.signature->addFreshPredicate(1,"p");
    TermList sort = SortHelper::getResultSort(aT.term());
    OperatorType* type = OperatorType::getPredicateType({sort});
    env.signature->getPredicate(p)->setType(type);
    Literal* l = Literal::create1(p,true,aT);
    Literal* res =0;
    bool constant, constTrue;
    bool litMod = eval.evaluate(l,constant,res,constTrue);
    if(litMod && res){
      aT.setTerm(res->nthArgument(0)->term());
    }
  }
  return aT;
}